

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetParser.cpp
# Opt level: O2

StringRef getArchSynonym(StringRef Arch)

{
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  StringRef *pSVar4;
  size_t sVar5;
  long *__s1;
  undefined8 uVar6;
  bool bVar7;
  StringRef SVar8;
  char *local_48;
  char local_40 [8];
  bool local_38;
  
  sVar5 = Arch.Length;
  __s1 = (long *)Arch.Data;
  local_38 = false;
  uVar1._0_1_ = '\x04';
  uVar1._1_1_ = '\0';
  uVar1._2_1_ = '\0';
  uVar1._3_1_ = '\0';
  uVar1._4_1_ = '\0';
  uVar1._5_1_ = '\0';
  uVar1._6_1_ = '\0';
  uVar1._7_1_ = '\0';
  uVar6 = uVar1;
  if (sVar5 == 2) {
    if ((short)*__s1 == 0x3576) {
      local_48 = "v5t";
      local_40[0] = '\x03';
      local_40[1] = '\0';
      local_40[2] = '\0';
      local_40[3] = '\0';
      local_40[4] = '\0';
      local_40[5] = '\0';
      local_40[6] = '\0';
      local_40[7] = '\0';
      local_38 = true;
      bVar7 = true;
      bVar2 = true;
    }
    else {
      bVar2 = false;
      bVar7 = true;
    }
LAB_001696a8:
    if ((!bVar7 && !bVar2) && (iVar3 = bcmp(__s1,"v6j",3), iVar3 == 0)) {
      uVar6._0_1_ = '\x02';
      uVar6._1_1_ = '\0';
      uVar6._2_1_ = '\0';
      uVar6._3_1_ = '\0';
      uVar6._4_1_ = '\0';
      uVar6._5_1_ = '\0';
      uVar6._6_1_ = '\0';
      uVar6._7_1_ = '\0';
      local_48 = "v6";
      goto LAB_00169a77;
    }
    if ((sVar5 == 4 && !bVar2) && ((int)*__s1 == 0x6c683676)) {
      uVar6._0_1_ = '\x03';
      uVar6._1_1_ = '\0';
      uVar6._2_1_ = '\0';
      uVar6._3_1_ = '\0';
      uVar6._4_1_ = '\0';
      uVar6._5_1_ = '\0';
      uVar6._6_1_ = '\0';
      uVar6._7_1_ = '\0';
      local_48 = "v6k";
      goto LAB_00169a77;
    }
    if ((((!bVar7 && !bVar2) && (iVar3 = bcmp(__s1,"v6m",3), iVar3 == 0)) ||
        ((sVar5 == 4 && !bVar2 && ((int)*__s1 == 0x6d733676)))) ||
       ((sVar5 == 5 && !bVar2 && (iVar3 = bcmp(__s1,"v6s-m",5), iVar3 == 0)))) {
      local_48 = "v6-m";
      goto LAB_00169a77;
    }
    if (((!bVar7 && !bVar2) && (iVar3 = bcmp(__s1,"v6z",3), iVar3 == 0)) ||
       ((sVar5 == 4 && !bVar2 && ((int)*__s1 == 0x6b7a3676)))) {
      local_48 = "v6kz";
      goto LAB_00169a77;
    }
    if ((((sVar5 == 2 && !bVar2) && ((short)*__s1 == 0x3776)) ||
        (((!bVar7 && !bVar2 && (iVar3 = bcmp(__s1,"v7a",3), iVar3 == 0)) ||
         ((sVar5 == 4 && !bVar2 && ((int)*__s1 == 0x6c683776)))))) ||
       ((!bVar7 && !bVar2 && (iVar3 = bcmp(__s1,"v7l",3), iVar3 == 0)))) {
      local_48 = "v7-a";
      goto LAB_00169a77;
    }
    if ((!bVar7 && !bVar2) && (iVar3 = bcmp(__s1,"v7r",3), iVar3 == 0)) {
      local_48 = "v7-r";
      goto LAB_00169a77;
    }
    if ((!bVar7 && !bVar2) && (iVar3 = bcmp(__s1,"v7m",3), iVar3 == 0)) {
      local_48 = "v7-m";
      goto LAB_00169a77;
    }
    if ((sVar5 == 4 && !bVar2) && ((int)*__s1 == 0x6d653776)) {
      uVar6._0_1_ = '\x05';
      uVar6._1_1_ = '\0';
      uVar6._2_1_ = '\0';
      uVar6._3_1_ = '\0';
      uVar6._4_1_ = '\0';
      uVar6._5_1_ = '\0';
      uVar6._6_1_ = '\0';
      uVar6._7_1_ = '\0';
      local_48 = "v7e-m";
      goto LAB_00169a77;
    }
    if (((((sVar5 == 2 && !bVar2) && ((short)*__s1 == 0x3876)) ||
         ((!bVar7 && !bVar2 && (iVar3 = bcmp(__s1,"v8a",3), iVar3 == 0)))) ||
        ((!bVar7 && !bVar2 && (iVar3 = bcmp(__s1,"v8l",3), iVar3 == 0)))) ||
       (((sVar5 == 7 && !bVar2 && (iVar3 = bcmp(__s1,"aarch64",7), iVar3 == 0)) ||
        ((sVar5 == 5 && !bVar2 && (iVar3 = bcmp(__s1,"arm64",5), iVar3 == 0)))))) {
      local_48 = "v8-a";
      goto LAB_00169a77;
    }
    uVar6._0_1_ = '\x06';
    uVar6._1_1_ = '\0';
    uVar6._2_1_ = '\0';
    uVar6._3_1_ = '\0';
    uVar6._4_1_ = '\0';
    uVar6._5_1_ = '\0';
    uVar6._6_1_ = '\0';
    uVar6._7_1_ = '\0';
    if ((sVar5 == 5 && !bVar2) && (iVar3 = bcmp(__s1,"v8.1a",5), iVar3 == 0)) {
      local_48 = "v8.1-a";
      goto LAB_00169a77;
    }
    if ((sVar5 == 5 && !bVar2) && (iVar3 = bcmp(__s1,"v8.2a",5), iVar3 == 0)) {
      local_48 = "v8.2-a";
      goto LAB_00169a77;
    }
    if ((sVar5 == 5 && !bVar2) && (iVar3 = bcmp(__s1,"v8.3a",5), iVar3 == 0)) {
      local_48 = "v8.3-a";
      goto LAB_00169a77;
    }
    if ((sVar5 == 5 && !bVar2) && (iVar3 = bcmp(__s1,"v8.4a",5), iVar3 == 0)) {
      local_48 = "v8.4-a";
      goto LAB_00169a77;
    }
    if ((!bVar7 && !bVar2) && (iVar3 = bcmp(__s1,"v8r",3), iVar3 == 0)) {
      local_48 = "v8-r";
      uVar6 = uVar1;
      goto LAB_00169a77;
    }
    uVar6._0_1_ = '\t';
    uVar6._1_1_ = '\0';
    uVar6._2_1_ = '\0';
    uVar6._3_1_ = '\0';
    uVar6._4_1_ = '\0';
    uVar6._5_1_ = '\0';
    uVar6._6_1_ = '\0';
    uVar6._7_1_ = '\0';
    if ((sVar5 == 8 && !bVar2) && (*__s1 == 0x657361622e6d3876)) {
      local_48 = "v8-m.base";
      goto LAB_00169a77;
    }
    if ((sVar5 == 8 && !bVar2) && (*__s1 == 0x6e69616d2e6d3876)) {
      local_48 = "v8-m.main";
      goto LAB_00169a77;
    }
    if (!bVar2) goto LAB_00169a97;
  }
  else {
    bVar7 = sVar5 != 3;
    if ((bVar7) || (iVar3 = bcmp(__s1,"v5e",3), iVar3 != 0)) {
      bVar2 = false;
      goto LAB_001696a8;
    }
    local_48 = "v5te";
LAB_00169a77:
    local_38 = true;
    local_40 = (char  [8])uVar6;
  }
  pSVar4 = llvm::Optional<llvm::StringRef>::getPointer((Optional<llvm::StringRef> *)&local_48);
  __s1 = (long *)pSVar4->Data;
  sVar5 = pSVar4->Length;
LAB_00169a97:
  SVar8.Length = sVar5;
  SVar8.Data = (char *)__s1;
  return SVar8;
}

Assistant:

static StringRef getArchSynonym(StringRef Arch) {
  return StringSwitch<StringRef>(Arch)
      .Case("v5", "v5t")
      .Case("v5e", "v5te")
      .Case("v6j", "v6")
      .Case("v6hl", "v6k")
      .Cases("v6m", "v6sm", "v6s-m", "v6-m")
      .Cases("v6z", "v6zk", "v6kz")
      .Cases("v7", "v7a", "v7hl", "v7l", "v7-a")
      .Case("v7r", "v7-r")
      .Case("v7m", "v7-m")
      .Case("v7em", "v7e-m")
      .Cases("v8", "v8a", "v8l", "aarch64", "arm64", "v8-a")
      .Case("v8.1a", "v8.1-a")
      .Case("v8.2a", "v8.2-a")
      .Case("v8.3a", "v8.3-a")
      .Case("v8.4a", "v8.4-a")
      .Case("v8r", "v8-r")
      .Case("v8m.base", "v8-m.base")
      .Case("v8m.main", "v8-m.main")
      .Default(Arch);
}